

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_mstring_copy_wcs(archive_mstring *aes,wchar_t *wcs)

{
  size_t len;
  
  if (wcs == (wchar_t *)0x0) {
    len = 0;
  }
  else {
    len = wcslen(wcs);
  }
  archive_mstring_copy_wcs_len(aes,wcs,len);
  return L'\0';
}

Assistant:

int
archive_mstring_copy_wcs(struct archive_mstring *aes, const wchar_t *wcs)
{
	return archive_mstring_copy_wcs_len(aes, wcs,
				wcs == NULL ? 0 : wcslen(wcs));
}